

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::cpp::QualifiedOneofCaseConstantName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *field)

{
  LogMessage *other;
  Descriptor *extraout_RDX;
  FieldDescriptor *field_00;
  AlphaNum *in_R8;
  string qualification;
  string local_128;
  string local_108;
  AlphaNum local_e8;
  pointer local_b8;
  size_type sStack_b0;
  LogMessage local_88;
  AlphaNum local_50;
  
  if (*(long *)(this + 0x28) == 0 || ((byte)this[1] & 0x10) == 0) {
    internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0x1cf);
    other = internal::LogMessage::operator<<(&local_88,"CHECK failed: field->containing_oneof(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_b8,other);
    internal::LogMessage::~LogMessage(&local_88);
    field = (FieldDescriptor *)extraout_RDX;
  }
  QualifiedClassName_abi_cxx11_(&local_108,*(cpp **)(this + 0x20),(Descriptor *)field);
  local_b8 = local_108._M_dataplus._M_p;
  sStack_b0 = local_108._M_string_length;
  local_e8.piece_data_ = "::";
  local_e8.piece_size_ = 2;
  OneofCaseConstantName_abi_cxx11_(&local_128,this,field_00);
  local_50.piece_data_ = local_128._M_dataplus._M_p;
  local_50.piece_size_ = local_128._M_string_length;
  StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_b8,&local_e8,&local_50,in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string QualifiedOneofCaseConstantName(const FieldDescriptor* field) {
  GOOGLE_DCHECK(field->containing_oneof());
  const std::string qualification =
      QualifiedClassName(field->containing_type());
  return StrCat(qualification, "::", OneofCaseConstantName(field));
}